

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O3

bool check_location_aliasing
               (explicit_location_info (*explicit_locations) [4],ir_variable *var,uint location,
               uint component,uint location_limit,glsl_type *type,uint interpolation,bool centroid,
               bool sample,bool patch,gl_shader_program *prog,gl_shader_stage stage)

{
  explicit_location_info *peVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  byte bVar5;
  ir_variable *piVar6;
  char *pcVar7;
  bool bVar8;
  char *fmt;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  
  while( true ) {
    uVar9 = *(uint *)&type->field_0x4;
    bVar10 = (byte)uVar9;
    if (bVar10 != 0x11) break;
    type = (type->fields).array;
  }
  if ((0xd < bVar10) || (bVar3 = true, (0x3fe3U >> (uVar9 & 0xf) & 1) == 0)) {
    bVar8 = false;
    bVar3 = false;
    if (bVar10 == 0xf) {
      uVar13 = 4;
      bVar3 = true;
      uVar9 = 0;
      goto LAB_001eb8b6;
    }
  }
  bVar8 = bVar3;
  bVar5 = 0;
  if ((byte)(uVar9 - 4) < 10) {
    bVar5 = (byte)*(undefined4 *)(&DAT_00228ba4 + (ulong)(uVar9 - 4 & 0xff) * 4);
  }
  if (bVar10 < 0x14) {
    uVar13 = ((uint)type->vector_elements << (bVar5 & 0x1f)) + component;
    switch(uVar9 & 0xff) {
    case 0:
    case 1:
    case 2:
    case 0x13:
      uVar9 = 0x20;
      break;
    case 3:
    case 7:
    case 8:
      uVar9 = 0x10;
      break;
    default:
      uVar9 = 0x40;
      break;
    case 5:
    case 6:
      uVar9 = 8;
      break;
    case 0xb:
      uVar9 = 1;
      break;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
      goto switchD_001eb88b_caseD_e;
    }
    bVar3 = false;
LAB_001eb8b6:
    bVar14 = location_limit <= location;
    if (!bVar14) {
      do {
        uVar12 = 0;
        do {
          uVar11 = (uint)uVar12;
          peVar1 = explicit_locations[location] + uVar12;
          piVar6 = peVar1->var;
          if (piVar6 == (ir_variable *)0x0) {
            if ((component <= uVar11) && (uVar11 < uVar13)) {
              peVar1->var = var;
              peVar1->base_type_is_integer = bVar8;
              peVar1->base_type_bit_size = uVar9;
              peVar1->interpolation = interpolation;
              peVar1->centroid = centroid;
              peVar1->sample = sample;
              peVar1->patch = patch;
            }
          }
          else {
            do {
              piVar6 = (ir_variable *)piVar6->type;
              cVar2 = *(char *)((long)&(piVar6->super_ir_instruction)._vptr_ir_instruction + 4);
            } while (cVar2 == '\x11');
            if (!(bool)(~bVar3 & cVar2 != '\x0f')) {
              pcVar4 = _mesa_shader_stage_to_string(stage);
              pcVar7 = " out";
              if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                  (undefined1  [44])0x4000) {
                pcVar7 = " in";
              }
              if (!bVar3) {
                var = peVar1->var;
              }
              linker_error(prog,
                           "%s shader has multiple %sputs sharing the same location that don\'t have the same underlying numerical type. Struct variable \'%s\', location %u\n"
                           ,pcVar4,pcVar7 + 1,var->name,(ulong)location);
              return bVar14;
            }
            if ((component <= uVar11) && (uVar11 < uVar13)) {
              pcVar4 = _mesa_shader_stage_to_string(stage);
              pcVar7 = " out";
              if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                  (undefined1  [44])0x4000) {
                pcVar7 = " in";
              }
              pcVar7 = pcVar7 + 1;
              fmt = 
              "%s shader has multiple %sputs explicitly assigned to location %d and component %d\n";
LAB_001ebb42:
              linker_error(prog,fmt,pcVar4,pcVar7,(ulong)location,uVar12);
              return bVar14;
            }
            if (peVar1->base_type_is_integer != bVar8) {
              pcVar4 = _mesa_shader_stage_to_string(stage);
              pcVar7 = " out";
              if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                  (undefined1  [44])0x4000) {
                pcVar7 = " in";
              }
              pcVar7 = pcVar7 + 1;
              fmt = 
              "%s shader has multiple %sputs sharing the same location that don\'t have the same underlying numerical type. Location %u component %u.\n"
              ;
              goto LAB_001ebb42;
            }
            if (peVar1->base_type_bit_size != uVar9) {
              pcVar4 = _mesa_shader_stage_to_string(stage);
              pcVar7 = " out";
              if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                  (undefined1  [44])0x4000) {
                pcVar7 = " in";
              }
              pcVar7 = pcVar7 + 1;
              fmt = 
              "%s shader has multiple %sputs sharing the same location that don\'t have the same underlying numerical bit size. Location %u component %u.\n"
              ;
              goto LAB_001ebb42;
            }
            if (peVar1->interpolation != interpolation) {
              pcVar4 = _mesa_shader_stage_to_string(stage);
              pcVar7 = " out";
              if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                  (undefined1  [44])0x4000) {
                pcVar7 = " in";
              }
              pcVar7 = pcVar7 + 1;
              fmt = 
              "%s shader has multiple %sputs sharing the same location that don\'t have the same interpolation qualification. Location %u component %u.\n"
              ;
              goto LAB_001ebb42;
            }
            if (((peVar1->centroid != centroid) || (peVar1->sample != sample)) ||
               (peVar1->patch != patch)) {
              pcVar4 = _mesa_shader_stage_to_string(stage);
              pcVar7 = " out";
              if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                  (undefined1  [44])0x4000) {
                pcVar7 = " in";
              }
              pcVar7 = pcVar7 + 1;
              fmt = 
              "%s shader has multiple %sputs sharing the same location that don\'t have the same auxiliary storage qualification. Location %u component %u.\n"
              ;
              goto LAB_001ebb42;
            }
          }
          uVar12 = (ulong)(uVar11 + 1);
          if ((uVar11 + 1 == 4) && (4 < uVar13)) {
            uVar13 = uVar13 - 4;
            location = location + 1;
            component = 0;
            uVar12 = 0;
          }
        } while ((uint)uVar12 < 4);
        location = location + 1;
        bVar14 = location >= location_limit;
      } while (location < location_limit);
    }
    return bVar14;
  }
switchD_001eb88b_caseD_e:
  __assert_fail("!\"unknown base type\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.h"
                ,0xbe,"unsigned int glsl_base_type_get_bit_size(const enum glsl_base_type)");
}

Assistant:

static bool
check_location_aliasing(struct explicit_location_info explicit_locations[][4],
                        ir_variable *var,
                        unsigned location,
                        unsigned component,
                        unsigned location_limit,
                        const glsl_type *type,
                        unsigned interpolation,
                        bool centroid,
                        bool sample,
                        bool patch,
                        gl_shader_program *prog,
                        gl_shader_stage stage)
{
   unsigned last_comp;
   unsigned base_type_bit_size;
   const glsl_type *type_without_array = type->without_array();
   const bool base_type_is_integer =
      glsl_base_type_is_integer(type_without_array->base_type);
   const bool is_struct = type_without_array->is_struct();
   if (is_struct) {
      /* structs don't have a defined underlying base type so just treat all
       * component slots as used and set the bit size to 0. If there is
       * location aliasing, we'll fail anyway later.
       */
      last_comp = 4;
      base_type_bit_size = 0;
   } else {
      unsigned dmul = type_without_array->is_64bit() ? 2 : 1;
      last_comp = component + type_without_array->vector_elements * dmul;
      base_type_bit_size =
         glsl_base_type_get_bit_size(type_without_array->base_type);
   }

   while (location < location_limit) {
      unsigned comp = 0;
      while (comp < 4) {
         struct explicit_location_info *info =
            &explicit_locations[location][comp];

         if (info->var) {
            if (info->var->type->without_array()->is_struct() || is_struct) {
               /* Structs cannot share location since they are incompatible
                * with any other underlying numerical type.
                */
               linker_error(prog,
                            "%s shader has multiple %sputs sharing the "
                            "same location that don't have the same "
                            "underlying numerical type. Struct variable '%s', "
                            "location %u\n",
                            _mesa_shader_stage_to_string(stage),
                            var->data.mode == ir_var_shader_in ? "in" : "out",
                            is_struct ? var->name : info->var->name,
                            location);
               return false;
            } else if (comp >= component && comp < last_comp) {
               /* Component aliasing is not allowed */
               linker_error(prog,
                            "%s shader has multiple %sputs explicitly "
                            "assigned to location %d and component %d\n",
                            _mesa_shader_stage_to_string(stage),
                            var->data.mode == ir_var_shader_in ? "in" : "out",
                            location, comp);
               return false;
            } else {
               /* From the OpenGL 4.60.5 spec, section 4.4.1 Input Layout
                * Qualifiers, Page 67, (Location aliasing):
                *
                *   " Further, when location aliasing, the aliases sharing the
                *     location must have the same underlying numerical type
                *     and bit width (floating-point or integer, 32-bit versus
                *     64-bit, etc.) and the same auxiliary storage and
                *     interpolation qualification."
                */

               /* If the underlying numerical type isn't integer, implicitly
                * it will be float or else we would have failed by now.
                */
               if (info->base_type_is_integer != base_type_is_integer) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "underlying numerical type. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }

               if (info->base_type_bit_size != base_type_bit_size) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "underlying numerical bit size. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }

               if (info->interpolation != interpolation) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "interpolation qualification. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }

               if (info->centroid != centroid ||
                   info->sample != sample ||
                   info->patch != patch) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "auxiliary storage qualification. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }
            }
         } else if (comp >= component && comp < last_comp) {
            info->var = var;
            info->base_type_is_integer = base_type_is_integer;
            info->base_type_bit_size = base_type_bit_size;
            info->interpolation = interpolation;
            info->centroid = centroid;
            info->sample = sample;
            info->patch = patch;
         }

         comp++;

         /* We need to do some special handling for doubles as dvec3 and
          * dvec4 consume two consecutive locations. We don't need to
          * worry about components beginning at anything other than 0 as
          * the spec does not allow this for dvec3 and dvec4.
          */
         if (comp == 4 && last_comp > 4) {
            last_comp = last_comp - 4;
            /* Bump location index and reset the component index */
            location++;
            comp = 0;
            component = 0;
         }
      }

      location++;
   }

   return true;
}